

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdRaycastMesh.cpp
# Opt level: O2

bool __thiscall
HACD::RMNode::Raycast
          (RMNode *this,Vec3<double> *from,Vec3<double> *dir,long *triID,Float *distance,
          Vec3<double> *hitPoint,Vec3<double> *hitNormal)

{
  Vec3<long> *pVVar1;
  Vec3<double> *pVVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  bool bVar14;
  bool bVar15;
  SArray<long,_16UL> *pSVar16;
  long lVar17;
  byte bVar18;
  size_t id;
  ulong uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  double dist;
  Vec3<double> normal1;
  Float distToSphere;
  double local_80;
  undefined8 local_78;
  double *local_70;
  Vec3<double> local_68;
  long *local_50;
  Vec3<double> *local_48;
  SArray<long,_16UL> *local_40;
  double local_38;
  
  bVar14 = BBox::Raycast(&this->m_bBox,from,dir,&local_38);
  if ((!bVar14) || (*distance <= local_38)) {
    bVar18 = 0;
  }
  else if (this->m_leaf == true) {
    local_78 = 0;
    pVVar1 = this->m_rm->m_triangles;
    pVVar2 = this->m_rm->m_vertices;
    local_80 = 0.0;
    local_40 = &this->m_triIDs;
    local_70 = distance;
    local_50 = triID;
    local_48 = hitPoint;
    for (uVar19 = 0; uVar19 < (this->m_triIDs).m_size; uVar19 = uVar19 + 1) {
      pSVar16 = local_40;
      if ((this->m_triIDs).m_maxSize != 0x10) {
        pSVar16 = (SArray<long,_16UL> *)(this->m_triIDs).m_data;
      }
      lVar3 = pSVar16->m_data0[uVar19];
      lVar17 = pVVar1[lVar3].m_data[1];
      lVar4 = pVVar1[lVar3].m_data[0];
      lVar5 = pVVar1[lVar3].m_data[2];
      dVar6 = pVVar2[lVar17].m_data[1] - pVVar2[lVar4].m_data[1];
      dVar7 = pVVar2[lVar17].m_data[2] - pVVar2[lVar4].m_data[2];
      dVar8 = pVVar2[lVar5].m_data[1] - pVVar2[lVar4].m_data[1];
      dVar9 = pVVar2[lVar17].m_data[0] - pVVar2[lVar4].m_data[0];
      dVar10 = pVVar2[lVar5].m_data[0] - pVVar2[lVar4].m_data[0];
      dVar11 = pVVar2[lVar5].m_data[2] - pVVar2[lVar4].m_data[2];
      auVar23._8_8_ = 0;
      auVar23._0_8_ = dVar6;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = dVar11;
      auVar30._8_8_ = 0;
      auVar30._0_8_ = dVar8 * dVar7;
      auVar12 = vfmsub231sd_fma(auVar30,auVar23,auVar28);
      auVar25._8_8_ = 0;
      auVar25._0_8_ = dVar10;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = dVar7;
      auVar29._8_8_ = 0;
      auVar29._0_8_ = dVar11 * dVar9;
      auVar13 = vfmsub231sd_fma(auVar29,auVar25,auVar27);
      auVar20._8_8_ = 0;
      auVar20._0_8_ = dVar9;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = dVar10 * dVar6;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = dVar8;
      auVar20 = vfmsub231sd_fma(auVar24,auVar20,auVar26);
      local_68.m_data[0] = auVar12._0_8_;
      local_68.m_data[1] = auVar13._0_8_;
      local_68.m_data[2] = auVar20._0_8_;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = dir->m_data[0];
      auVar21._8_8_ = 0;
      auVar21._0_8_ = local_68.m_data[1] * dir->m_data[1];
      auVar13 = vfmadd231sd_fma(auVar21,auVar12,auVar13);
      auVar12._8_8_ = 0;
      auVar12._0_8_ = dir->m_data[2];
      auVar13 = vfmadd231sd_fma(auVar13,auVar20,auVar12);
      if (0.0 < auVar13._0_8_) {
        lVar17 = IntersectRayTriangle
                           (from,dir,pVVar2 + lVar4,pVVar2 + lVar17,pVVar2 + lVar5,&local_80);
        if ((lVar17 == 1) && (local_80 < *local_70)) {
          Vec3<double>::Normalize(&local_68);
          hitNormal->m_data[0] = local_68.m_data[0];
          hitNormal->m_data[1] = local_68.m_data[1];
          hitNormal->m_data[2] = local_68.m_data[2];
          auVar22._8_8_ = local_80;
          auVar22._0_8_ = local_80;
          dVar6 = dir->m_data[2];
          dVar8 = dir->m_data[1];
          dVar7 = from->m_data[2];
          dVar9 = from->m_data[1];
          local_48->m_data[0] = local_80 * dir->m_data[0] + from->m_data[0];
          local_48->m_data[1] = local_80 * dVar8 + dVar9;
          local_48->m_data[2] = local_80 * dVar6 + dVar7;
          local_78 = CONCAT71((int7)((ulong)local_48 >> 8),1);
          dVar6 = (double)vmovlpd_avx(auVar22);
          *local_70 = dVar6;
          *local_50 = lVar3;
        }
      }
    }
    bVar18 = (byte)local_78;
  }
  else {
    if (this->m_idRight < 0) {
      bVar14 = false;
    }
    else {
      bVar14 = Raycast(this->m_rm->m_nodes + this->m_idRight,from,dir,triID,distance,hitPoint,
                       hitNormal);
    }
    if (this->m_idLeft < 0) {
      bVar15 = false;
    }
    else {
      bVar15 = Raycast(this->m_rm->m_nodes + this->m_idLeft,from,dir,triID,distance,hitPoint,
                       hitNormal);
    }
    bVar18 = bVar14 | bVar15;
  }
  return (bool)(bVar18 & 1);
}

Assistant:

bool RMNode::Raycast(const Vec3<Float> & from, const Vec3<Float> & dir, long & triID, Float & distance, Vec3<Real> & hitPoint, Vec3<Real> & hitNormal) const 
	{
		Float distToSphere;
		if (m_bBox.Raycast(from, dir, distToSphere) && (distToSphere < distance))
		{
			if (m_leaf)
			{
				long f, i1, j1, k1;
				Vec3<long> * const triangles = m_rm->m_triangles;			
				Vec3<Float> * const vertices = m_rm->m_vertices;
				Vec3<Real> u1, v1, normal1;
				double dist = 0.0;
				long nhit = 0;
				bool ret = false;
				for(size_t id = 0; id < m_triIDs.Size(); ++id)
				{
					f = m_triIDs[id];
					i1 = triangles[f].X();
					j1 = triangles[f].Y();
					k1 = triangles[f].Z();
					u1 = vertices[j1] - vertices[i1];
					v1 = vertices[k1] - vertices[i1];
					normal1 = (u1 ^ v1);
					if (dir * normal1 > 0.0)
					{
						nhit = IntersectRayTriangle(from, dir, vertices[i1], vertices[j1], vertices[k1], dist);
						if (nhit==1 && distance>dist)
						{
							normal1.Normalize();
							hitNormal = normal1;
							hitPoint = from + dist * dir;
							distance = dist;
							triID = f;
							ret = true;
						}						
					}
				}
				return ret;
			}
			bool ret1 = false;
			bool ret2 = false;
			if (m_idRight >= 0) ret1 = m_rm->m_nodes[m_idRight].Raycast(from, dir, triID, distance, hitPoint, hitNormal);
			if (m_idLeft >= 0)  ret2 = m_rm->m_nodes[m_idLeft].Raycast(from, dir, triID, distance, hitPoint, hitNormal);
			return ret1 || ret2;
		}
		return false;
	}